

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_23::current_milliseconds_test::test(current_milliseconds_test *this)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_178;
  duration<long,_std::ratio<1L,_1000000000L>_> local_170;
  duration<long,_std::ratio<1L,_1000L>_> local_168;
  _func_unsigned_long_void_ptr_varargs *local_160;
  fun_ptr f;
  uint64_t size;
  first_pass_data d;
  logic_error e;
  allocator<char> local_b9;
  string local_b8 [32];
  undefined1 local_98 [56];
  uint64_t res;
  asmcode code;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  uint64_t *local_18;
  uint64_t millisecondsUTC;
  current_milliseconds_test *this_local;
  
  millisecondsUTC = (uint64_t)this;
  local_30.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_28.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_30);
  local_20.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_28);
  local_18 = (uint64_t *)std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
  assembler::asmcode::asmcode((asmcode *)&res);
  local_98._48_8_ = (uint64_t *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"(current-milliseconds)",&local_b9);
  compile_fixture::get_asmcode((compile_fixture *)local_98,(string *)this);
  assembler::asmcode::operator=((asmcode *)&res,(asmcode *)local_98);
  assembler::asmcode::~asmcode((asmcode *)local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  assembler::first_pass_data::first_pass_data((first_pass_data *)&size);
  local_160 = (_func_unsigned_long_void_ptr_varargs *)
              assembler::assemble((ulong *)&f,(first_pass_data *)&size,(asmcode *)&res);
  if (local_160 != (_func_unsigned_long_void_ptr_varargs *)0x0) {
    local_98._48_8_ = (*local_160)(&(this->super_compile_fixture).ctxt);
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)&(this->super_compile_fixture).compiled_functions,&local_160,(unsigned_long *)&f);
    local_98._48_8_ = (ulong)local_98._48_8_ >> 1;
  }
  TestEq<bool,bool>(true,local_18 <= (ulong)local_98._48_8_,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
                    ,0x173a,"void skiwi::(anonymous namespace)::current_milliseconds_test::test()");
  local_178.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_170.__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch(&local_178);
  local_168.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_170);
  local_18 = (uint64_t *)std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_168);
  TestEq<bool,bool>(true,(ulong)local_98._48_8_ <= local_18,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
                    ,0x173c,"void skiwi::(anonymous namespace)::current_milliseconds_test::test()");
  assembler::first_pass_data::~first_pass_data((first_pass_data *)&size);
  assembler::asmcode::~asmcode((asmcode *)&res);
  return;
}

Assistant:

void test()
      {      
      uint64_t millisecondsUTC = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();

      asmcode code;
      uint64_t res = 0;
      try
        {
        code = get_asmcode("(current-milliseconds)");
        }
      catch (std::logic_error e)
        {
        std::cout << e.what();
        }
      first_pass_data d;
      uint64_t size;
      fun_ptr f = (fun_ptr)assemble(size, d, code);
      if (f)
        {
        res = f(&ctxt);
        compiled_functions.emplace_back(f, size);
        res >>= 1;
        }
      TEST_ASSERT(millisecondsUTC <= res);
      millisecondsUTC = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();
      TEST_ASSERT(res <= millisecondsUTC);
      }